

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int gt_phys_redir_timeridx(CPUARMState_conflict *env)

{
  ARMMMUIdx AVar1;
  CPUARMState_conflict *env_local;
  
  AVar1 = arm_mmu_idx_aarch64(env);
  if ((AVar1 == ARMMMUIdx_E20_0) || (AVar1 == ARMMMUIdx_E20_2 || AVar1 == ARMMMUIdx_E20_2_PAN)) {
    env_local._4_4_ = 2;
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

static int gt_phys_redir_timeridx(CPUARMState *env)
{
    switch (arm_mmu_idx(env)) {
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
        return GTIMER_HYP;
    default:
        return GTIMER_PHYS;
    }
}